

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O0

void __thiscall
sjtu::UserManager::query_order(UserManager *this,OrderManager *order_manager,int argc,string *argv)

{
  void *pvVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  pair<long,_bool> pVar5;
  pair<sjtu::orderType,_long> *ret;
  locType tmpticket;
  userType *cur;
  pair<long,_bool> tmp;
  string uname;
  timeType *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe98;
  StringHasher *in_stack_fffffffffffffea0;
  unsigned_long_long *in_stack_fffffffffffffee8;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffef0;
  long local_a8;
  long local_a0;
  long local_98;
  undefined1 local_90;
  string local_78 [32];
  hashType local_58;
  long local_50;
  byte local_48;
  string local_40 [48];
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40,(string *)(in_RCX + 0x20));
  std::__cxx11::string::string(local_78,local_40);
  local_58 = StringHasher::operator()(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pVar5 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_98 = pVar5.first;
  local_90 = pVar5.second;
  local_50 = local_98;
  local_48 = local_90;
  std::__cxx11::string::~string(local_78);
  if ((local_48 & 1) == 0) {
    pvVar1 = (void *)std::ostream::operator<<(&std::cout,-1);
    std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_a0 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),&local_50)
    ;
    if (*(int *)(local_a0 + 0x6c) == *(int *)(in_RDI + 0x18)) {
      pvVar1 = (void *)std::ostream::operator<<(&std::cout,*(int *)(local_a0 + 0x80));
      std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
      local_a8 = *(long *)(local_a0 + 0x70);
      while (local_a8 != -1) {
        lVar2 = (**(code **)(**(long **)(local_10 + 0x10) + 0x10))
                          (*(long **)(local_10 + 0x10),&local_a8);
        poVar3 = std::operator<<((ostream *)&std::cout,'[');
        if (*(int *)(lVar2 + 0xa8) == 0) {
          pcVar4 = "success";
        }
        else {
          pcVar4 = "refunded";
          if (*(int *)(lVar2 + 0xa8) == 1) {
            pcVar4 = "pending";
          }
        }
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,(char *)(lVar2 + 0x15));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = std::operator<<(poVar3,(char *)(lVar2 + 0x4c));
        std::operator<<(poVar3,' ');
        poVar3 = operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        poVar3 = std::operator<<(poVar3," -> ");
        poVar3 = std::operator<<(poVar3,(char *)(lVar2 + 0x75));
        std::operator<<(poVar3,' ');
        poVar3 = operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(lVar2 + 0xa4));
        poVar3 = std::operator<<(poVar3,' ');
        in_stack_fffffffffffffe70 =
             (ostream *)std::ostream::operator<<(poVar3,*(int *)(lVar2 + 0xa0));
        std::ostream::operator<<(in_stack_fffffffffffffe70,std::endl<char,std::char_traits<char>>);
        local_a8 = *(long *)(lVar2 + 0xb8);
      }
    }
    else {
      pvVar1 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void UserManager::query_order(OrderManager *order_manager, int argc, std::string *argv) {
            std::string uname = argv[1];
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(uname));
            if (tmp.second == false) std::cout << -1 << std::endl;
            else {
                userType *cur = UserFile->read(tmp.first);
                if (cur->is_online != online_flag) std::cout << -1 << std::endl;
                else {
                    std::cout << cur->order_count << std::endl;
                    locType tmpticket = cur->head;
                    while (tmpticket != -1) {
                        auto ret = order_manager->OrderFile->read(tmpticket);
                        std::cout << '[' << (ret -> first.status ? (ret -> first.status == pending ? "pending" : "refunded") : "success" ) << "] " << ret->first.trainID << ' ' << ret->first.station[0] << ' ' << ret->first.date[0] << " -> " << ret->first.station[1] << ' ' << ret->first.date[1] << ' ' << ret->first.price << ' ' << ret->first.num << std::endl;
                        tmpticket = ret -> second;
                    }
                }
            }
        }